

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall
spdlog::logger::log_<fmt::v6::basic_string_view<char>,std::__cxx11::string,std::__cxx11::string>
          (logger *this,source_loc loc,level_enum lvl,basic_string_view<char> *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  int iVar1;
  string_view_t a_logger_name;
  string_view_t msg;
  bool traceback_enabled;
  memory_buf_t buf;
  log_msg log_msg;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_1b0;
  log_msg local_90;
  
  iVar1 = (this->level_).super___atomic_base<int>._M_i;
  traceback_enabled = details::backtracer::enabled(&this->tracer_);
  if (iVar1 <= (int)lvl || traceback_enabled) {
    local_1b0.super_buffer<char>.ptr_ = local_1b0.store_;
    local_1b0.super_buffer<char>.size_ = 0;
    local_1b0.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0019e2b8;
    local_1b0.super_buffer<char>.capacity_ = 0xfa;
    ::fmt::v6::
    format_to<fmt::v6::basic_string_view<char>,std::__cxx11::string_const&,std::__cxx11::string_const&,250ul,char>
              (&local_1b0,fmt,args,args_1);
    a_logger_name.data_ = (this->name_)._M_dataplus._M_p;
    a_logger_name.size_ = (this->name_)._M_string_length;
    msg.size_ = local_1b0.super_buffer<char>.size_;
    msg.data_ = local_1b0.super_buffer<char>.ptr_;
    details::log_msg::log_msg(&local_90,loc,a_logger_name,lvl,msg);
    log_it_(this,&local_90,iVar1 <= (int)lvl,traceback_enabled);
    ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (&local_1b0);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, const FormatString &fmt, const Args &... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, args...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }